

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbscreen.cpp
# Opt level: O2

Format __thiscall QXcbScreen::format(QXcbScreen *this)

{
  uint8_t depth;
  QXcbConnection *connection;
  Format FVar1;
  xcb_visualtype_t *visual;
  long in_FS_OFFSET;
  bool needsRgbSwap;
  Format format;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  format = 0xaaaaaaaa;
  needsRgbSwap = true;
  connection = *(QXcbConnection **)(this + 0x10);
  depth = *(uint8_t *)(*(long *)(*(long *)(this + 0x20) + 8) + 0x26);
  visual = visualForId(this,*(xcb_visualid_t *)(*(long *)(*(long *)(this + 0x20) + 8) + 0x20));
  qt_xcb_imageFormatForVisual(connection,depth,visual,&format,&needsRgbSwap);
  FVar1 = Format_RGB32;
  if (format != Format_Invalid) {
    FVar1 = format;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return FVar1;
  }
  __stack_chk_fail();
}

Assistant:

QImage::Format QXcbScreen::format() const
{
    QImage::Format format;
    bool needsRgbSwap;
    qt_xcb_imageFormatForVisual(connection(), screen()->root_depth, visualForId(screen()->root_visual), &format, &needsRgbSwap);
    // We are ignoring needsRgbSwap here and just assumes the backing-store will handle it.
    if (format != QImage::Format_Invalid)
        return format;
    return QImage::Format_RGB32;
}